

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::RBFKernel::ByteSizeLong(RBFKernel *this)

{
  size_t sVar1;
  
  sVar1 = (ulong)(-(uint)(this->gamma_ != 0.0) & 1) * 9;
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t RBFKernel::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.RBFKernel)
  size_t total_size = 0;

  // double gamma = 1;
  if (this->gamma() != 0) {
    total_size += 1 + 8;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}